

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  _func_int *p_Var11;
  _func_int **pp_Var12;
  int *piVar13;
  Layer *pLVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  long lVar30;
  Mat *pMVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  _func_int **pp_Var39;
  _func_int **pp_Var40;
  long lVar41;
  long lVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  int y_1;
  int iVar48;
  int iVar49;
  ulong uVar50;
  int y;
  ulong uVar51;
  float *pfVar52;
  ulong uVar53;
  ulong uVar54;
  void *pvVar55;
  int iVar56;
  undefined1 (*pauVar57) [16];
  uint uVar58;
  int iVar59;
  long lVar60;
  int w;
  int iVar61;
  float *pfVar62;
  void *pvVar63;
  undefined1 auVar64 [16];
  undefined1 extraout_var [12];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar69;
  v4sf one;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar70;
  float fVar82;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [12];
  undefined1 auVar86 [16];
  undefined4 uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  float fVar100;
  float fVar102;
  undefined1 auVar95 [16];
  float fVar103;
  undefined1 auVar96 [16];
  float fVar101;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  int h_1;
  int size;
  int h;
  int outw;
  int outh;
  int outh_1;
  Option opt_b;
  ulong local_278;
  ulong local_270;
  ulong local_220;
  long local_218;
  _func_int **local_208;
  undefined1 local_1f8 [16];
  _func_int **local_1e0;
  Mat local_1b8;
  ulong local_170;
  _func_int **local_168;
  long local_160;
  undefined1 local_158 [16];
  Option *local_148;
  _func_int **local_140;
  ulong local_138;
  Mat *local_130;
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  int local_f0;
  size_t local_e8;
  void *local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  long *local_b8;
  undefined4 uStack_b0;
  int iStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  undefined8 local_98;
  long local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar6 = bottom_blob->w;
  iVar7 = bottom_blob->h;
  uVar46 = bottom_blob->elemsize;
  local_138 = (ulong)bottom_blob->elempack;
  p_Var11 = this->_vptr_Deconvolution_x86[-3];
  uVar58 = 1;
  if (opt->use_packing_layout == true) {
    uVar58 = (uint)(((&this->field_0xd0)[(long)p_Var11] & 3) == 0) * 3 + 1;
  }
  iVar61 = *(int *)(&this->field_0xd4 + (long)p_Var11);
  iVar32 = *(int *)(&this->field_0xdc + (long)p_Var11);
  local_1f8._0_4_ = iVar32;
  iVar44 = *(int *)(&this->field_0xe4 + (long)p_Var11);
  iVar43 = (*(int *)(&this->field_0xd8 + (long)p_Var11) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var11);
  iVar49 = *(int *)(&this->field_0xe8 + (long)p_Var11);
  iVar48 = *(int *)(&this->field_0xfc + (long)p_Var11);
  iVar56 = *(int *)(&this->field_0x100 + (long)p_Var11);
  uVar54 = (long)*(int *)(&this->field_0xd0 + (long)p_Var11) / (long)(int)uVar58;
  iVar35 = (int)uVar54;
  local_1b8.cstep = 0;
  local_1b8.data = (_func_int **)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  p_Var11 = this->_vptr_Deconvolution_x86[-3];
  lVar60 = 0x10;
  if ((((((*(int *)(&this->field_0xec + (long)p_Var11) < 1) &&
         (*(int *)(&this->field_0xf0 + (long)p_Var11) < 1)) &&
        (*(int *)(&this->field_0xf4 + (long)p_Var11) < 1)) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var11) < 1)) &&
      ((*(int *)(&this->field_0x104 + (long)p_Var11) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var11) < 1)))) && (lVar60 = 8, &local_1b8 != top_blob)
     ) {
    piVar13 = top_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    local_1b8.data = top_blob->data;
    local_1b8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1b8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1b8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_1b8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_1b8.elempack = top_blob->elempack;
    local_1b8.allocator = top_blob->allocator;
    uVar26 = top_blob->dims;
    uVar27 = top_blob->w;
    uVar28 = top_blob->h;
    uVar29 = top_blob->d;
    local_1b8.c = top_blob->c;
    local_1b8.cstep = top_blob->cstep;
    local_1b8.dims = uVar26;
    local_1b8.w = uVar27;
    local_1b8.h = uVar28;
    local_1b8.d = uVar29;
  }
  iVar32 = (iVar61 + -1) * iVar32;
  iVar48 = (iVar6 + -1) * iVar44 + iVar32 + iVar48 + 1;
  local_148 = opt;
  local_130 = top_blob;
  Mat::create(&local_1b8,iVar48,iVar56 + (iVar7 + -1) * iVar49 + iVar43 + 1,iVar35,
              (uVar46 / local_138) * (ulong)uVar58,uVar58,*(Allocator **)(&opt->lightmode + lVar60))
  ;
  iVar44 = local_1b8.h;
  iVar61 = local_1b8.w;
  auVar21 = _DAT_00595160;
  auVar68 = _DAT_00595130;
  auVar67 = _DAT_00595120;
  iVar49 = -100;
  if (((_func_int **)local_1b8.data != (_func_int **)0x0) &&
     ((long)local_1b8.c * local_1b8.cstep != 0)) {
    pp_Var12 = this->_vptr_Deconvolution_x86;
    p_Var11 = pp_Var12[-3];
    uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var11);
    uVar9 = *(uint *)(&this->field_0xd8 + (long)p_Var11);
    iVar49 = uVar9 * uVar8;
    if (local_148->use_sgemm_convolution == true) {
      local_128 = bottom_blob->data;
      piVar13 = bottom_blob->refcount;
      uStack_120 = SUB84(piVar13,0);
      uStack_11c = (undefined4)((ulong)piVar13 >> 0x20);
      local_118 = (undefined4)bottom_blob->elemsize;
      uStack_114 = (undefined4)(bottom_blob->elemsize >> 0x20);
      local_110 = bottom_blob->elempack;
      local_108 = bottom_blob->allocator;
      uVar24 = bottom_blob->dims;
      uVar25 = bottom_blob->d;
      local_f0 = bottom_blob->c;
      local_e8 = bottom_blob->cstep;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      local_100 = CONCAT44(bottom_blob->h * bottom_blob->w,uVar24);
      uStack_f8 = CONCAT44(uVar25,1);
      local_98 = 0;
      local_d8 = (void *)0x0;
      uStack_d0 = 0;
      uStack_cc = 0;
      local_c8 = 0;
      uStack_c4 = 0;
      uStack_c0 = 0;
      local_b8 = (long *)0x0;
      uStack_b0 = 0;
      iStack_ac = 0;
      uStack_a8 = 0;
      uStack_a4 = 0;
      local_a0 = 0;
      local_78._0_1_ = local_148->lightmode;
      local_78._1_3_ = *(undefined3 *)&local_148->field_0x1;
      local_78._4_4_ = local_148->num_threads;
      local_68 = local_148->workspace_allocator;
      uStack_60._0_4_ = local_148->openmp_blocktime;
      uStack_60._4_1_ = local_148->use_winograd_convolution;
      uStack_60._5_1_ = local_148->use_sgemm_convolution;
      uStack_60._6_1_ = local_148->use_int8_inference;
      uStack_60._7_1_ = local_148->use_vulkan_compute;
      local_58._0_1_ = local_148->use_bf16_storage;
      local_58._1_1_ = local_148->use_fp16_packed;
      local_58._2_1_ = local_148->use_fp16_storage;
      local_58._3_1_ = local_148->use_fp16_arithmetic;
      local_58._4_1_ = local_148->use_int8_packed;
      local_58._5_1_ = local_148->use_int8_storage;
      local_58._6_1_ = local_148->use_int8_arithmetic;
      local_58._7_1_ = local_148->use_packing_layout;
      uStack_50._0_1_ = local_148->use_shader_pack8;
      uStack_50._1_1_ = local_148->use_subgroup_basic;
      uStack_50._2_1_ = local_148->use_subgroup_vote;
      uStack_50._3_1_ = local_148->use_subgroup_ballot;
      uStack_50._4_1_ = local_148->use_subgroup_shuffle;
      uStack_50._5_1_ = local_148->use_image_storage;
      uStack_50._6_1_ = local_148->use_tensor_storage;
      uStack_50._7_1_ = local_148->use_reserved_0;
      local_48._0_4_ = local_148->flush_denormals;
      local_48._4_1_ = local_148->use_local_pool_allocator;
      local_48._5_1_ = local_148->use_shader_local_memory;
      local_48._6_1_ = local_148->use_cooperative_matrix;
      local_48._7_1_ = local_148->use_winograd23_convolution;
      uStack_40._0_1_ = local_148->use_winograd43_convolution;
      uStack_40._1_1_ = local_148->use_winograd63_convolution;
      uStack_40._2_1_ = local_148->use_a53_a55_optimized_kernel;
      uStack_40._3_1_ = local_148->use_reserved_7;
      uStack_40._4_1_ = local_148->use_reserved_8;
      uStack_40._5_1_ = local_148->use_reserved_9;
      uStack_40._6_1_ = local_148->use_reserved_10;
      uStack_40._7_1_ = local_148->use_reserved_11;
      pAStack_70 = local_1b8.allocator;
      (*this->gemm->_vptr_Layer[7])(this->gemm,&local_128,&local_d8);
      auVar21 = _DAT_005921e0;
      auVar68 = _DAT_005921d0;
      auVar67 = _DAT_005920d0;
      iVar61 = (iVar48 * *(int *)(&this->field_0xe8 + (long)this->_vptr_Deconvolution_x86[-3]) -
               *(int *)(&this->field_0xe4 + (long)this->_vptr_Deconvolution_x86[-3]) * iVar6) *
               uVar58;
      if (uVar58 == 1) {
        if (0 < iVar35) {
          uVar46 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          lVar60 = (long)local_1b8.h * (long)local_1b8.w;
          local_278 = 0;
          iVar32 = (int)((uVar46 * lVar60 + 0xf & 0xfffffffffffffff0) / uVar46);
          if (local_1b8.dims == 4) {
            iVar32 = (int)lVar60;
          }
          uVar58 = iVar32 * local_1b8.d;
          pp_Var12 = this->_vptr_Deconvolution_x86;
          uVar53 = 1;
          if (1 < iVar35) {
            uVar53 = uVar54 & 0xffffffff;
          }
          lVar41 = (long)iVar49 * (long)iStack_ac * CONCAT44(uStack_c4,local_c8);
          local_158._0_8_ = lVar41;
          lVar60 = (ulong)uVar58 - 1;
          auVar64._8_4_ = (int)lVar60;
          auVar64._0_8_ = lVar60;
          auVar64._12_4_ = (int)((ulong)lVar60 >> 0x20);
          lVar60 = (long)local_1b8.data + 0xc;
          auVar64 = auVar64 ^ _DAT_005920d0;
          do {
            p_Var11 = pp_Var12[-3];
            uVar87 = 0;
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var11) != 0) &&
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var11) *
                *(long *)(&this->field_0x1e8 + (long)p_Var11) != 0)) {
              uVar87 = *(undefined4 *)
                        (*(long *)(&this->field_0x1a8 + (long)p_Var11) + local_278 * 4);
            }
            if (0 < (int)uVar58) {
              uVar54 = 0;
              do {
                auVar88._8_4_ = (int)uVar54;
                auVar88._0_8_ = uVar54;
                auVar88._12_4_ = (int)(uVar54 >> 0x20);
                auVar95 = (auVar88 | auVar21) ^ auVar67;
                iVar32 = auVar64._4_4_;
                if ((bool)(~(iVar32 < auVar95._4_4_ ||
                            auVar64._0_4_ < auVar95._0_4_ && auVar95._4_4_ == iVar32) & 1)) {
                  *(undefined4 *)(lVar60 + uVar54 * 4 + -0xc) = uVar87;
                }
                if (auVar95._12_4_ <= auVar64._12_4_ &&
                    (auVar95._8_4_ <= auVar64._8_4_ || auVar95._12_4_ != auVar64._12_4_)) {
                  *(undefined4 *)(lVar60 + uVar54 * 4 + -8) = uVar87;
                }
                auVar95 = (auVar88 | auVar68) ^ auVar67;
                iVar44 = auVar95._4_4_;
                if (iVar44 <= iVar32 && (iVar44 != iVar32 || auVar95._0_4_ <= auVar64._0_4_)) {
                  *(undefined4 *)(lVar60 + uVar54 * 4 + -4) = uVar87;
                  *(undefined4 *)(lVar60 + uVar54 * 4) = uVar87;
                }
                uVar54 = uVar54 + 4;
              } while ((uVar58 + 3 & 0xfffffffc) != uVar54);
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var12[-3])) {
              pfVar62 = (float *)(local_278 * lVar41 + (long)local_d8);
              iVar32 = 0;
              do {
                p_Var11 = pp_Var12[-3];
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var11)) {
                  iVar44 = 0;
                  do {
                    if (0 < iVar7) {
                      pfVar52 = (float *)((long)local_1b8.data +
                                         (long)iVar44 *
                                         (long)*(int *)(&this->field_0xdc + (long)p_Var11) * 4 +
                                         (long)iVar32 *
                                         (long)*(int *)(&this->field_0xe0 + (long)p_Var11) *
                                         uVar46 * (long)local_1b8.w +
                                         local_1b8.cstep * uVar46 * local_278);
                      iVar49 = 0;
                      do {
                        iVar48 = iVar6;
                        if (0 < iVar6) {
                          do {
                            *pfVar52 = *pfVar52 + *pfVar62;
                            pfVar52 = pfVar52 + *(int *)(&this->field_0xe4 + (long)pp_Var12[-3]);
                            pfVar62 = pfVar62 + 1;
                            iVar48 = iVar48 + -1;
                          } while (iVar48 != 0);
                        }
                        pfVar52 = pfVar52 + iVar61;
                        iVar49 = iVar49 + 1;
                      } while (iVar49 != iVar7);
                    }
                    iVar44 = iVar44 + 1;
                    p_Var11 = pp_Var12[-3];
                  } while (iVar44 < *(int *)(&this->field_0xd4 + (long)p_Var11));
                }
                iVar32 = iVar32 + 1;
              } while (iVar32 < *(int *)(&this->field_0xd8 + (long)pp_Var12[-3]));
            }
            local_278 = local_278 + 1;
            lVar60 = lVar60 + local_1b8.cstep * uVar46;
          } while (local_278 != uVar53);
        }
      }
      else if ((uVar58 == 4) && (0 < iVar35)) {
        pp_Var12 = this->_vptr_Deconvolution_x86;
        uVar46 = 0;
        do {
          pfVar62 = (float *)((long)iStack_ac * uVar46 * (long)iVar49 * CONCAT44(uStack_c4,local_c8)
                             + (long)local_d8);
          lVar60 = (long)local_1b8.w;
          uVar53 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          pp_Var39 = (_func_int **)(local_1b8.cstep * uVar46 * uVar53 + (long)local_1b8.data);
          uVar51 = local_1b8.h * lVar60;
          uVar50 = (uVar53 * uVar51 + 0xf & 0xfffffffffffffff0) / uVar53;
          if (local_1b8.dims == 4) {
            uVar50 = uVar51;
          }
          p_Var11 = pp_Var12[-3];
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var11) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var11) *
              *(long *)(&this->field_0x1e8 + (long)p_Var11) == 0)) {
            uVar58 = local_1b8.d * (int)uVar50;
            if (0 < (int)uVar58) {
              memset(pp_Var39,0,(ulong)uVar58 << 4);
            }
          }
          else {
            iVar32 = local_1b8.d * (int)uVar50;
            if (0 < iVar32) {
              puVar1 = (undefined4 *)(*(long *)(&this->field_0x1a8 + (long)p_Var11) + uVar46 * 0x10)
              ;
              uVar87 = *puVar1;
              uVar4 = puVar1[1];
              uVar5 = puVar1[2];
              uVar23 = puVar1[3];
              pp_Var40 = pp_Var39;
              do {
                *(undefined4 *)pp_Var40 = uVar87;
                *(undefined4 *)((long)pp_Var40 + 4) = uVar4;
                *(undefined4 *)(pp_Var40 + 1) = uVar5;
                *(undefined4 *)((long)pp_Var40 + 0xc) = uVar23;
                pp_Var40 = pp_Var40 + 2;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
            }
          }
          if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var12[-3])) {
            iVar32 = 0;
            do {
              p_Var11 = pp_Var12[-3];
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var11)) {
                iVar44 = 0;
                do {
                  if (0 < iVar7) {
                    pfVar52 = (float *)((long)pp_Var39 +
                                       (long)(*(int *)(&this->field_0xdc + (long)p_Var11) * iVar44 *
                                             4) * 4 +
                                       (long)*(int *)(&this->field_0xe0 + (long)p_Var11) *
                                       (long)iVar32 * uVar53 * lVar60);
                    iVar48 = 0;
                    do {
                      iVar56 = iVar6;
                      if (0 < iVar6) {
                        do {
                          fVar66 = pfVar62[1];
                          auVar95._0_4_ = pfVar62[2];
                          fVar69 = pfVar62[3];
                          *pfVar52 = *pfVar62 + *pfVar52;
                          pfVar52[1] = fVar66 + pfVar52[1];
                          pfVar52[2] = auVar95._0_4_ + pfVar52[2];
                          pfVar52[3] = fVar69 + pfVar52[3];
                          pfVar52 = pfVar52 + (long)*(int *)(&this->field_0xe4 + (long)pp_Var12[-3])
                                              * 4;
                          pfVar62 = pfVar62 + 4;
                          iVar56 = iVar56 + -1;
                        } while (iVar56 != 0);
                      }
                      pfVar52 = pfVar52 + iVar61;
                      iVar48 = iVar48 + 1;
                    } while (iVar48 != iVar7);
                  }
                  iVar44 = iVar44 + 1;
                  p_Var11 = pp_Var12[-3];
                } while (iVar44 < *(int *)(&this->field_0xd4 + (long)p_Var11));
              }
              iVar32 = iVar32 + 1;
            } while (iVar32 < *(int *)(&this->field_0xd8 + (long)pp_Var12[-3]));
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != (uVar54 & 0xffffffff));
      }
      pLVar14 = this->activation;
      if (pLVar14 != (Layer *)0x0) {
        (*pLVar14->_vptr_Layer[9])(pLVar14,&local_1b8,local_148);
      }
      piVar13 = (int *)CONCAT44(uStack_cc,uStack_d0);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_b8 == (long *)0x0) {
            if (local_d8 != (void *)0x0) {
              free(local_d8);
            }
          }
          else {
            (**(code **)(*local_b8 + 0x18))();
          }
        }
      }
      local_98 = 0;
      local_d8 = (void *)0x0;
      uStack_d0 = 0;
      uStack_cc = 0;
      local_c8 = 0;
      uStack_c4 = 0;
      uStack_c0 = 0;
      uStack_b0 = 0;
      iStack_ac = 0;
      uStack_a8 = 0;
      uStack_a4 = 0;
      local_a0 = 0;
      piVar13 = (int *)CONCAT44(uStack_11c,uStack_120);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_108 == (Allocator *)0x0) {
            if (local_128 != (void *)0x0) {
              free(local_128);
            }
          }
          else {
            (*local_108->_vptr_Allocator[3])();
          }
        }
      }
      local_e8 = 0;
      local_128 = (void *)0x0;
      uStack_120 = 0;
      uStack_11c = 0;
      local_118 = 0;
      uStack_114 = 0;
      local_110 = 0;
      local_100 = 0;
      uStack_f8 = 0;
      local_f0 = 0;
    }
    else {
      if ((((int)local_138 == 4) && (uVar58 == 4)) &&
         (local_170 = (ulong)local_1b8.c, 0 < (long)local_170)) {
        iVar6 = *(int *)(&this->field_0xdc + (long)p_Var11);
        local_1f8._0_4_ = *(undefined4 *)(&this->field_0xe0 + (long)p_Var11);
        iVar7 = *(int *)(&this->field_0xe4 + (long)p_Var11);
        iVar48 = *(int *)(&this->field_0xe8 + (long)p_Var11);
        uVar87 = *(undefined4 *)(&this->field_0x114 + (long)p_Var11);
        lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var11);
        local_160 = (long)(int)(uVar8 * uVar9 * 0x10);
        iVar56 = (1 - uVar8) * iVar6;
        local_168 = (_func_int **)CONCAT44(local_168._4_4_,iVar56);
        local_270 = 0;
        fVar66 = (float)DAT_00595160;
        auVar95._0_4_ = DAT_00595160._4_4_;
        fVar69 = DAT_00595160._8_4_;
        do {
          if (0 < local_1b8.h) {
            iVar35 = bottom_blob->w;
            iVar38 = bottom_blob->h;
            pauVar57 = (undefined1 (*) [16])
                       (local_1b8.cstep * local_270 *
                        CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) +
                       (long)local_1b8.data);
            uVar10 = bottom_blob->c;
            local_278._0_4_ = 0;
            do {
              if (0 < local_1b8.w) {
                uVar45 = 0;
                iVar59 = iVar56;
                do {
                  auVar76 = ZEXT816(0);
                  if (lVar60 == 0) {
                    auVar89 = ZEXT816(0);
                  }
                  else {
                    auVar89 = *(undefined1 (*) [16])(lVar60 + local_270 * 0x10);
                  }
                  if (0 < (int)uVar10) {
                    pvVar63 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar15 = bottom_blob->data;
                    lVar41 = (long)bottom_blob->w * bottom_blob->elemsize;
                    local_158._0_8_ = lVar41;
                    uVar46 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar53 = 0;
                        uVar54 = 0;
                        do {
                          iVar33 = (((int)uVar54 - uVar9) + 1) * local_1f8._0_4_ + (int)local_278;
                          if (((-1 < iVar33) && (iVar34 = iVar33 / iVar48, iVar33 % iVar48 == 0)) &&
                             ((0 < (int)uVar8 && (iVar34 < iVar38)))) {
                            lVar30 = iVar34 * lVar41 +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar46;
                            uVar50 = (ulong)uVar8;
                            uVar51 = uVar53;
                            iVar33 = iVar59;
                            do {
                              if (((-1 < iVar33) && (iVar34 = iVar33 / iVar7, iVar33 % iVar7 == 0))
                                 && (iVar34 < iVar35)) {
                                lVar42 = (long)(iVar34 << 2);
                                fVar108 = *(float *)((long)pvVar15 + lVar42 * 4 + lVar30);
                                fVar70 = *(float *)((long)pvVar15 + lVar42 * 4 + lVar30 + 4);
                                uVar47 = uVar51 & 0xffffffff;
                                pfVar62 = (float *)((long)pvVar63 + uVar47 * 4);
                                fVar94 = *(float *)((long)pvVar15 + lVar42 * 4 + lVar30 + 8);
                                fVar101 = auVar89._4_4_;
                                fVar104 = auVar89._8_4_;
                                fVar105 = auVar89._12_4_;
                                fVar82 = *(float *)((long)pvVar15 + lVar42 * 4 + lVar30 + 0xc);
                                pfVar52 = (float *)((long)pvVar63 + uVar47 * 4 + 0x10);
                                pfVar2 = (float *)((long)pvVar63 + uVar47 * 4 + 0x20);
                                pfVar3 = (float *)((long)pvVar63 + uVar47 * 4 + 0x30);
                                auVar89._0_4_ =
                                     fVar82 * *pfVar3 +
                                     fVar94 * *pfVar2 + fVar70 * *pfVar52 +
                                     fVar108 * *pfVar62 + auVar89._0_4_;
                                auVar89._4_4_ =
                                     fVar82 * pfVar3[1] +
                                     fVar94 * pfVar2[1] + fVar70 * pfVar52[1] +
                                     fVar108 * pfVar62[1] + fVar101;
                                auVar89._8_4_ =
                                     fVar82 * pfVar3[2] +
                                     fVar94 * pfVar2[2] + fVar70 * pfVar52[2] +
                                     fVar108 * pfVar62[2] + fVar104;
                                auVar89._12_4_ =
                                     fVar82 * pfVar3[3] +
                                     fVar94 * pfVar2[3] + fVar70 * pfVar52[3] +
                                     fVar108 * pfVar62[3] + fVar105;
                              }
                              uVar51 = uVar51 + 0x10;
                              iVar33 = iVar33 + iVar6;
                              uVar50 = uVar50 - 1;
                            } while (uVar50 != 0);
                          }
                          uVar54 = uVar54 + 1;
                          uVar53 = uVar53 + (ulong)uVar8 * 0x10;
                        } while (uVar54 != uVar9);
                      }
                      pvVar63 = (void *)((long)pvVar63 + local_160 * 4);
                      uVar46 = uVar46 + 1;
                    } while (uVar46 != uVar10);
                  }
                  fVar70 = auVar89._0_4_;
                  fVar94 = auVar89._4_4_;
                  fVar82 = auVar89._8_4_;
                  fVar101 = auVar89._12_4_;
                  fVar108 = auVar21._12_4_;
                  switch(uVar87) {
                  case 1:
                    auVar89 = maxps(auVar89,auVar76);
                    break;
                  case 2:
                    auVar75 = maxps(auVar89,auVar76);
                    auVar76 = minps(auVar89,auVar76);
                    fVar108 = **(float **)(&this->field_0x118 + (long)p_Var11);
                    auVar89._4_4_ = fVar108 * auVar76._4_4_ + auVar75._4_4_;
                    auVar89._0_4_ = fVar108 * auVar76._0_4_ + auVar75._0_4_;
                    auVar89._8_4_ = fVar108 * auVar76._8_4_ + auVar75._8_4_;
                    auVar89._12_4_ = fVar108 * auVar76._12_4_ + auVar75._12_4_;
                    break;
                  case 3:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var11);
                    uVar5 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var11))[1];
                    auVar73._4_4_ = uVar4;
                    auVar73._0_4_ = uVar4;
                    auVar73._8_4_ = uVar4;
                    auVar73._12_4_ = uVar4;
                    auVar96._4_4_ = uVar5;
                    auVar96._0_4_ = uVar5;
                    auVar96._8_4_ = uVar5;
                    auVar96._12_4_ = uVar5;
                    auVar76 = maxps(auVar89,auVar73);
                    auVar89 = minps(auVar76,auVar96);
                    break;
                  case 4:
                    auVar90._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                    auVar90._8_4_ = -fVar82;
                    auVar90._12_4_ = -fVar101;
                    auVar76 = minps(auVar90,auVar67);
                    auVar76 = maxps(auVar76,auVar68);
                    fVar94 = auVar76._0_4_ * 1.442695 + 0.5;
                    fVar101 = auVar76._4_4_ * 1.442695 + 0.5;
                    fVar105 = auVar76._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar76._12_4_ * 1.442695 + 0.5;
                    fVar70 = (float)(int)fVar94;
                    fVar82 = (float)(int)fVar101;
                    fVar104 = (float)(int)fVar105;
                    fVar106 = (float)(int)fVar107;
                    fVar70 = fVar70 - (float)(-(uint)(fVar94 < fVar70) & (uint)fVar66);
                    fVar82 = fVar82 - (float)(-(uint)(fVar101 < fVar82) & (uint)auVar95._0_4_);
                    fVar104 = fVar104 - (float)(-(uint)(fVar105 < fVar104) & (uint)fVar69);
                    fVar106 = fVar106 - (float)(-(uint)(fVar107 < fVar106) & (uint)fVar108);
                    fVar94 = fVar70 * -0.6931472 + auVar76._0_4_;
                    fVar101 = fVar82 * -0.6931472 + auVar76._4_4_;
                    fVar105 = fVar104 * -0.6931472 + auVar76._8_4_;
                    fVar107 = fVar106 * -0.6931472 + auVar76._12_4_;
                    auVar74._0_4_ =
                         fVar94 + fVar66 +
                         (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) *
                            fVar94 + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) *
                         fVar94 * fVar94;
                    auVar74._4_4_ =
                         fVar101 + auVar95._0_4_ +
                         (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                            fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                         fVar101 * fVar101;
                    auVar74._8_4_ =
                         fVar105 + fVar69 +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105;
                    auVar74._12_4_ =
                         fVar107 + fVar108 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107;
                    auVar97._0_4_ =
                         (float)((int)fVar70 * 0x800000 + (int)fVar66) * auVar74._0_4_ + fVar66;
                    auVar97._4_4_ =
                         (float)((int)fVar82 * 0x800000 + (int)auVar95._0_4_) * auVar74._4_4_ +
                         auVar95._0_4_;
                    auVar97._8_4_ =
                         (float)((int)fVar104 * 0x800000 + (int)fVar69) * auVar74._8_4_ + fVar69;
                    auVar97._12_4_ =
                         (float)((int)fVar106 * 0x800000 + (int)fVar108) * auVar74._12_4_ + fVar108;
                    auVar76 = rcpps(auVar74,auVar97);
                    fVar70 = auVar76._0_4_;
                    fVar94 = auVar76._4_4_;
                    fVar82 = auVar76._8_4_;
                    fVar101 = auVar76._12_4_;
                    auVar89._0_4_ = (fVar66 - auVar97._0_4_ * fVar70) * fVar70 + fVar70;
                    auVar89._4_4_ = (auVar95._0_4_ - auVar97._4_4_ * fVar94) * fVar94 + fVar94;
                    auVar89._8_4_ = (fVar69 - auVar97._8_4_ * fVar82) * fVar82 + fVar82;
                    auVar89._12_4_ = (fVar108 - auVar97._12_4_ * fVar101) * fVar101 + fVar101;
                    break;
                  case 5:
                    auVar76 = minps(auVar89,auVar67);
                    auVar76 = maxps(auVar76,auVar68);
                    fVar104 = auVar76._0_4_ * 1.442695 + 0.5;
                    fVar105 = auVar76._4_4_ * 1.442695 + 0.5;
                    fVar106 = auVar76._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar76._12_4_ * 1.442695 + 0.5;
                    fVar93 = (float)(int)fVar104;
                    fVar100 = (float)(int)fVar105;
                    fVar102 = (float)(int)fVar106;
                    fVar103 = (float)(int)fVar107;
                    fVar93 = fVar93 - (float)(-(uint)(fVar104 < fVar93) & (uint)fVar66);
                    fVar100 = fVar100 - (float)(-(uint)(fVar105 < fVar100) & (uint)auVar95._0_4_);
                    fVar102 = fVar102 - (float)(-(uint)(fVar106 < fVar102) & (uint)fVar69);
                    fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar108);
                    fVar104 = auVar76._0_4_ - fVar93 * 0.6931472;
                    fVar105 = auVar76._4_4_ - fVar100 * 0.6931472;
                    fVar106 = auVar76._8_4_ - fVar102 * 0.6931472;
                    fVar107 = auVar76._12_4_ - fVar103 * 0.6931472;
                    auVar109._0_4_ =
                         (float)((int)fVar93 * 0x800000 + (int)fVar66) *
                         (fVar104 + fVar66 +
                         (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) *
                            fVar104 + 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) *
                         fVar104 * fVar104) + fVar66;
                    auVar109._4_4_ =
                         (float)((int)fVar100 * 0x800000 + (int)auVar95._0_4_) *
                         (fVar105 + auVar95._0_4_ +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105) + auVar95._0_4_;
                    auVar109._8_4_ =
                         (float)((int)fVar102 * 0x800000 + (int)fVar69) *
                         (fVar106 + fVar69 +
                         (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                            fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                         fVar106 * fVar106) + fVar69;
                    auVar109._12_4_ =
                         (float)((int)fVar103 * 0x800000 + (int)fVar108) *
                         (fVar107 + fVar108 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107) + fVar108;
                    auVar76 = maxps(auVar109,_DAT_005951d0);
                    fVar104 = (float)(auVar76._0_4_ & 0x807fffff | 0x3f000000);
                    fVar106 = (float)(auVar76._4_4_ & 0x807fffff | 0x3f000000);
                    fVar93 = (float)(auVar76._8_4_ & 0x807fffff | 0x3f000000);
                    fVar102 = (float)(auVar76._12_4_ & 0x807fffff | 0x3f000000);
                    fVar105 = fVar104 + -1.0 +
                              (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
                    fVar107 = fVar106 + -1.0 +
                              (float)(-(uint)(fVar106 < 0.70710677) & (uint)fVar106);
                    fVar100 = fVar93 + -1.0 + (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar93);
                    fVar103 = fVar102 + -1.0 +
                              (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
                    auVar83._0_4_ =
                         ~-(uint)(auVar109._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar66)) * 0.6931472
                                 + fVar105 +
                                (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984
                                       ) * fVar105 + -0.12420141) * fVar105 + 0.14249323) * fVar105
                                    + -0.16668057) * fVar105 + 0.20000714) * fVar105 + -0.24999994)
                                  * fVar105 + 0.3333333) * fVar105 + -0.5) * fVar105 * fVar105) *
                               -2.0);
                    auVar83._4_4_ =
                         ~-(uint)(auVar109._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar106 < 0.70710677) & (uint)auVar95._0_4_)) *
                                 0.6931472 + fVar107 +
                                (((((((((fVar107 * 0.070376836 + -0.1151461) * fVar107 + 0.116769984
                                       ) * fVar107 + -0.12420141) * fVar107 + 0.14249323) * fVar107
                                    + -0.16668057) * fVar107 + 0.20000714) * fVar107 + -0.24999994)
                                  * fVar107 + 0.3333333) * fVar107 + -0.5) * fVar107 * fVar107) *
                               -2.0);
                    auVar83._8_4_ =
                         ~-(uint)(auVar109._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                                 fVar100 +
                                (((((((((fVar100 * 0.070376836 + -0.1151461) * fVar100 + 0.116769984
                                       ) * fVar100 + -0.12420141) * fVar100 + 0.14249323) * fVar100
                                    + -0.16668057) * fVar100 + 0.20000714) * fVar100 + -0.24999994)
                                  * fVar100 + 0.3333333) * fVar100 + -0.5) * fVar100 * fVar100) *
                               -2.0);
                    auVar83._12_4_ =
                         ~-(uint)(auVar109._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar108)) * 0.6931472
                                 + fVar103 +
                                (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984
                                       ) * fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103
                                    + -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994)
                                  * fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) *
                               -2.0);
                    auVar71._0_8_ =
                         CONCAT44(-(uint)(auVar109._4_4_ <= 0.0),-(uint)(auVar109._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar71._8_4_ = -(uint)(auVar109._8_4_ <= 0.0) & 0x7fffffff;
                    auVar71._12_4_ = -(uint)(auVar109._12_4_ <= 0.0) & 0x7fffffff;
                    auVar76 = minps(auVar71 | auVar83,auVar67);
                    auVar76 = maxps(auVar76,auVar68);
                    fVar104 = auVar76._0_4_ * 1.442695 + 0.5;
                    fVar105 = auVar76._4_4_ * 1.442695 + 0.5;
                    fVar106 = auVar76._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar76._12_4_ * 1.442695 + 0.5;
                    fVar93 = (float)(int)fVar104;
                    fVar100 = (float)(int)fVar105;
                    fVar102 = (float)(int)fVar106;
                    fVar103 = (float)(int)fVar107;
                    fVar93 = fVar93 - (float)(-(uint)(fVar104 < fVar93) & (uint)fVar66);
                    fVar100 = fVar100 - (float)(-(uint)(fVar105 < fVar100) & (uint)auVar95._0_4_);
                    fVar102 = fVar102 - (float)(-(uint)(fVar106 < fVar102) & (uint)fVar69);
                    fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar108);
                    fVar104 = auVar76._0_4_ - fVar93 * 0.6931472;
                    fVar105 = auVar76._4_4_ - fVar100 * 0.6931472;
                    fVar106 = auVar76._8_4_ - fVar102 * 0.6931472;
                    fVar107 = auVar76._12_4_ - fVar103 * 0.6931472;
                    auVar72._0_4_ =
                         fVar104 + fVar66 +
                         (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) *
                            fVar104 + 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) *
                         fVar104 * fVar104;
                    auVar72._4_4_ =
                         fVar105 + auVar95._0_4_ +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105;
                    auVar72._8_4_ =
                         fVar106 + fVar69 +
                         (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                            fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                         fVar106 * fVar106;
                    auVar72._12_4_ =
                         fVar107 + fVar108 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107;
                    fVar93 = (float)((int)fVar93 * 0x800000 + (int)fVar66) * auVar72._0_4_ + fVar66;
                    fVar100 = (float)((int)fVar100 * 0x800000 + (int)auVar95._0_4_) * auVar72._4_4_
                              + auVar95._0_4_;
                    fVar102 = (float)((int)fVar102 * 0x800000 + (int)fVar69) * auVar72._8_4_ +
                              fVar69;
                    fVar108 = (float)((int)fVar103 * 0x800000 + (int)fVar108) * auVar72._12_4_ +
                              fVar108;
                    auVar76._4_4_ = fVar100;
                    auVar76._0_4_ = fVar93;
                    auVar76._8_4_ = fVar102;
                    auVar76._12_4_ = fVar108;
                    auVar76 = rcpps(auVar72,auVar76);
                    fVar104 = auVar76._0_4_;
                    fVar105 = auVar76._4_4_;
                    fVar106 = auVar76._8_4_;
                    fVar107 = auVar76._12_4_;
                    auVar89._0_4_ =
                         fVar70 * (fVar104 + fVar104 + -1.0 +
                                  (2.0 - fVar93 * (fVar104 + fVar104)) * fVar104);
                    auVar89._4_4_ =
                         fVar94 * (fVar105 + fVar105 + -1.0 +
                                  (2.0 - fVar100 * (fVar105 + fVar105)) * fVar105);
                    auVar89._8_4_ =
                         fVar82 * (fVar106 + fVar106 + -1.0 +
                                  (2.0 - fVar102 * (fVar106 + fVar106)) * fVar106);
                    auVar89._12_4_ =
                         fVar101 * (fVar107 + fVar107 + -1.0 +
                                   (2.0 - fVar108 * (fVar107 + fVar107)) * fVar107);
                    break;
                  case 6:
                    fVar108 = **(float **)(&this->field_0x118 + (long)p_Var11);
                    fVar104 = (*(float **)(&this->field_0x118 + (long)p_Var11))[1];
                    auVar75._0_4_ = fVar108 * fVar70 + fVar104;
                    auVar75._4_4_ = fVar108 * fVar94 + fVar104;
                    auVar75._8_4_ = fVar108 * fVar82 + fVar104;
                    auVar75._12_4_ = fVar108 * fVar101 + fVar104;
                    auVar76 = maxps(auVar75,auVar76);
                    auVar76 = minps(auVar76,auVar21);
                    auVar89._0_4_ = fVar70 * auVar76._0_4_;
                    auVar89._4_4_ = fVar94 * auVar76._4_4_;
                    auVar89._8_4_ = fVar82 * auVar76._8_4_;
                    auVar89._12_4_ = fVar101 * auVar76._12_4_;
                  }
                  *pauVar57 = auVar89;
                  pauVar57 = pauVar57 + 1;
                  uVar45 = uVar45 + 1;
                  iVar59 = iVar59 + 1;
                } while (uVar45 != local_1b8.w);
              }
              local_278._0_4_ = (int)local_278 + 1;
            } while ((int)local_278 != local_1b8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_170);
      }
      auVar21 = _DAT_00595160;
      auVar68 = _DAT_00595130;
      auVar67 = _DAT_00595120;
      if ((((int)local_138 == 1) && (uVar58 == 4)) &&
         (local_170 = (ulong)local_1b8.c, 0 < (long)local_170)) {
        p_Var11 = pp_Var12[-3];
        iVar6 = *(int *)(&this->field_0xdc + (long)p_Var11);
        iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var11);
        local_1f8._0_4_ = iVar7;
        iVar48 = *(int *)(&this->field_0xe4 + (long)p_Var11);
        iVar56 = *(int *)(&this->field_0xe8 + (long)p_Var11);
        uVar87 = *(undefined4 *)(&this->field_0x114 + (long)p_Var11);
        lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var11);
        uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var11);
        uVar9 = *(uint *)(&this->field_0xd8 + (long)p_Var11);
        local_160 = (long)(int)(uVar8 * uVar9 * 4);
        iVar35 = (1 - uVar8) * iVar6;
        local_168 = (_func_int **)CONCAT44(local_168._4_4_,iVar35);
        local_270 = 0;
        fVar66 = (float)DAT_00595160;
        auVar95._0_4_ = DAT_00595160._4_4_;
        fVar69 = DAT_00595160._8_4_;
        do {
          if (0 < local_1b8.h) {
            iVar38 = bottom_blob->w;
            iVar59 = bottom_blob->h;
            pauVar57 = (undefined1 (*) [16])
                       (local_1b8.cstep * local_270 *
                        CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) +
                       (long)local_1b8.data);
            uVar10 = bottom_blob->c;
            local_278._0_4_ = 0;
            do {
              if (0 < local_1b8.w) {
                uVar45 = 0;
                iVar33 = iVar35;
                do {
                  auVar76 = ZEXT816(0);
                  if (lVar60 == 0) {
                    auVar91 = ZEXT816(0);
                  }
                  else {
                    auVar91 = *(undefined1 (*) [16])(lVar60 + local_270 * 0x10);
                  }
                  if (0 < (int)uVar10) {
                    pvVar63 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    lVar41 = (long)bottom_blob->w * bottom_blob->elemsize;
                    local_158._0_8_ = lVar41;
                    uVar46 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar53 = 0;
                        uVar54 = 0;
                        do {
                          iVar34 = (((int)uVar54 - uVar9) + 1) * iVar7 + (int)local_278;
                          if (((-1 < iVar34) && (iVar36 = iVar34 / iVar56, iVar34 % iVar56 == 0)) &&
                             ((iVar36 < iVar59 && (0 < (int)uVar8)))) {
                            uVar50 = (ulong)uVar8;
                            uVar51 = uVar53;
                            auVar89 = auVar91;
                            iVar34 = iVar33;
                            do {
                              auVar91 = auVar89;
                              if (((-1 < iVar34) && (iVar37 = iVar34 / iVar48, iVar34 % iVar48 == 0)
                                  ) && (iVar37 < iVar38)) {
                                fVar108 = *(float *)((long)bottom_blob->data +
                                                    (long)iVar37 * 4 +
                                                    iVar36 * lVar41 +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar46);
                                pfVar62 = (float *)((long)pvVar63 + (uVar51 & 0xffffffff) * 4);
                                auVar91._0_4_ = auVar89._0_4_ + fVar108 * *pfVar62;
                                auVar91._4_4_ = auVar89._4_4_ + fVar108 * pfVar62[1];
                                auVar91._8_4_ = auVar89._8_4_ + fVar108 * pfVar62[2];
                                auVar91._12_4_ = auVar89._12_4_ + fVar108 * pfVar62[3];
                              }
                              uVar51 = uVar51 + 4;
                              iVar34 = iVar34 + iVar6;
                              uVar50 = uVar50 - 1;
                              auVar89 = auVar91;
                            } while (uVar50 != 0);
                          }
                          uVar54 = uVar54 + 1;
                          uVar53 = uVar53 + (ulong)uVar8 * 4;
                        } while (uVar54 != uVar9);
                      }
                      pvVar63 = (void *)((long)pvVar63 + local_160 * 4);
                      uVar46 = uVar46 + 1;
                    } while (uVar46 != uVar10);
                  }
                  fVar70 = auVar91._0_4_;
                  fVar94 = auVar91._4_4_;
                  fVar82 = auVar91._8_4_;
                  fVar101 = auVar91._12_4_;
                  fVar108 = auVar21._12_4_;
                  switch(uVar87) {
                  case 1:
                    auVar91 = maxps(auVar91,auVar76);
                    break;
                  case 2:
                    auVar89 = maxps(auVar91,auVar76);
                    auVar76 = minps(auVar91,auVar76);
                    fVar108 = **(float **)(&this->field_0x118 + (long)p_Var11);
                    auVar91._4_4_ = fVar108 * auVar76._4_4_ + auVar89._4_4_;
                    auVar91._0_4_ = fVar108 * auVar76._0_4_ + auVar89._0_4_;
                    auVar91._8_4_ = fVar108 * auVar76._8_4_ + auVar89._8_4_;
                    auVar91._12_4_ = fVar108 * auVar76._12_4_ + auVar89._12_4_;
                    break;
                  case 3:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var11);
                    uVar5 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var11))[1];
                    auVar79._4_4_ = uVar4;
                    auVar79._0_4_ = uVar4;
                    auVar79._8_4_ = uVar4;
                    auVar79._12_4_ = uVar4;
                    auVar98._4_4_ = uVar5;
                    auVar98._0_4_ = uVar5;
                    auVar98._8_4_ = uVar5;
                    auVar98._12_4_ = uVar5;
                    auVar76 = maxps(auVar91,auVar79);
                    auVar91 = minps(auVar76,auVar98);
                    break;
                  case 4:
                    auVar92._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                    auVar92._8_4_ = -fVar82;
                    auVar92._12_4_ = -fVar101;
                    auVar76 = minps(auVar92,auVar67);
                    auVar76 = maxps(auVar76,auVar68);
                    fVar94 = auVar76._0_4_ * 1.442695 + 0.5;
                    fVar101 = auVar76._4_4_ * 1.442695 + 0.5;
                    fVar105 = auVar76._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar76._12_4_ * 1.442695 + 0.5;
                    fVar70 = (float)(int)fVar94;
                    fVar82 = (float)(int)fVar101;
                    fVar104 = (float)(int)fVar105;
                    fVar106 = (float)(int)fVar107;
                    fVar70 = fVar70 - (float)(-(uint)(fVar94 < fVar70) & (uint)fVar66);
                    fVar82 = fVar82 - (float)(-(uint)(fVar101 < fVar82) & (uint)auVar95._0_4_);
                    fVar104 = fVar104 - (float)(-(uint)(fVar105 < fVar104) & (uint)fVar69);
                    fVar106 = fVar106 - (float)(-(uint)(fVar107 < fVar106) & (uint)fVar108);
                    fVar94 = fVar70 * -0.6931472 + auVar76._0_4_;
                    fVar101 = fVar82 * -0.6931472 + auVar76._4_4_;
                    fVar105 = fVar104 * -0.6931472 + auVar76._8_4_;
                    fVar107 = fVar106 * -0.6931472 + auVar76._12_4_;
                    auVar80._0_4_ =
                         fVar94 + fVar66 +
                         (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) *
                            fVar94 + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) *
                         fVar94 * fVar94;
                    auVar80._4_4_ =
                         fVar101 + auVar95._0_4_ +
                         (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                            fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                         fVar101 * fVar101;
                    auVar80._8_4_ =
                         fVar105 + fVar69 +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105;
                    auVar80._12_4_ =
                         fVar107 + fVar108 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107;
                    auVar99._0_4_ =
                         (float)((int)fVar70 * 0x800000 + (int)fVar66) * auVar80._0_4_ + fVar66;
                    auVar99._4_4_ =
                         (float)((int)fVar82 * 0x800000 + (int)auVar95._0_4_) * auVar80._4_4_ +
                         auVar95._0_4_;
                    auVar99._8_4_ =
                         (float)((int)fVar104 * 0x800000 + (int)fVar69) * auVar80._8_4_ + fVar69;
                    auVar99._12_4_ =
                         (float)((int)fVar106 * 0x800000 + (int)fVar108) * auVar80._12_4_ + fVar108;
                    auVar76 = rcpps(auVar80,auVar99);
                    fVar70 = auVar76._0_4_;
                    fVar94 = auVar76._4_4_;
                    fVar82 = auVar76._8_4_;
                    fVar101 = auVar76._12_4_;
                    auVar91._0_4_ = (fVar66 - auVar99._0_4_ * fVar70) * fVar70 + fVar70;
                    auVar91._4_4_ = (auVar95._0_4_ - auVar99._4_4_ * fVar94) * fVar94 + fVar94;
                    auVar91._8_4_ = (fVar69 - auVar99._8_4_ * fVar82) * fVar82 + fVar82;
                    auVar91._12_4_ = (fVar108 - auVar99._12_4_ * fVar101) * fVar101 + fVar101;
                    break;
                  case 5:
                    auVar76 = minps(auVar91,auVar67);
                    auVar76 = maxps(auVar76,auVar68);
                    fVar104 = auVar76._0_4_ * 1.442695 + 0.5;
                    fVar105 = auVar76._4_4_ * 1.442695 + 0.5;
                    fVar106 = auVar76._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar76._12_4_ * 1.442695 + 0.5;
                    fVar93 = (float)(int)fVar104;
                    fVar100 = (float)(int)fVar105;
                    fVar102 = (float)(int)fVar106;
                    fVar103 = (float)(int)fVar107;
                    fVar93 = fVar93 - (float)(-(uint)(fVar104 < fVar93) & (uint)fVar66);
                    fVar100 = fVar100 - (float)(-(uint)(fVar105 < fVar100) & (uint)auVar95._0_4_);
                    fVar102 = fVar102 - (float)(-(uint)(fVar106 < fVar102) & (uint)fVar69);
                    fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar108);
                    fVar104 = auVar76._0_4_ - fVar93 * 0.6931472;
                    fVar105 = auVar76._4_4_ - fVar100 * 0.6931472;
                    fVar106 = auVar76._8_4_ - fVar102 * 0.6931472;
                    fVar107 = auVar76._12_4_ - fVar103 * 0.6931472;
                    auVar110._0_4_ =
                         (float)((int)fVar93 * 0x800000 + (int)fVar66) *
                         (fVar104 + fVar66 +
                         (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) *
                            fVar104 + 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) *
                         fVar104 * fVar104) + fVar66;
                    auVar110._4_4_ =
                         (float)((int)fVar100 * 0x800000 + (int)auVar95._0_4_) *
                         (fVar105 + auVar95._0_4_ +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105) + auVar95._0_4_;
                    auVar110._8_4_ =
                         (float)((int)fVar102 * 0x800000 + (int)fVar69) *
                         (fVar106 + fVar69 +
                         (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                            fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                         fVar106 * fVar106) + fVar69;
                    auVar110._12_4_ =
                         (float)((int)fVar103 * 0x800000 + (int)fVar108) *
                         (fVar107 + fVar108 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107) + fVar108;
                    auVar76 = maxps(auVar110,_DAT_005951d0);
                    fVar104 = (float)(auVar76._0_4_ & 0x807fffff | 0x3f000000);
                    fVar106 = (float)(auVar76._4_4_ & 0x807fffff | 0x3f000000);
                    fVar93 = (float)(auVar76._8_4_ & 0x807fffff | 0x3f000000);
                    fVar102 = (float)(auVar76._12_4_ & 0x807fffff | 0x3f000000);
                    fVar105 = fVar104 + -1.0 +
                              (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
                    fVar107 = fVar106 + -1.0 +
                              (float)(-(uint)(fVar106 < 0.70710677) & (uint)fVar106);
                    fVar100 = fVar93 + -1.0 + (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar93);
                    fVar103 = fVar102 + -1.0 +
                              (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
                    auVar84._0_4_ =
                         ~-(uint)(auVar110._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar66)) * 0.6931472
                                 + fVar105 +
                                (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984
                                       ) * fVar105 + -0.12420141) * fVar105 + 0.14249323) * fVar105
                                    + -0.16668057) * fVar105 + 0.20000714) * fVar105 + -0.24999994)
                                  * fVar105 + 0.3333333) * fVar105 + -0.5) * fVar105 * fVar105) *
                               -2.0);
                    auVar84._4_4_ =
                         ~-(uint)(auVar110._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar106 < 0.70710677) & (uint)auVar95._0_4_)) *
                                 0.6931472 + fVar107 +
                                (((((((((fVar107 * 0.070376836 + -0.1151461) * fVar107 + 0.116769984
                                       ) * fVar107 + -0.12420141) * fVar107 + 0.14249323) * fVar107
                                    + -0.16668057) * fVar107 + 0.20000714) * fVar107 + -0.24999994)
                                  * fVar107 + 0.3333333) * fVar107 + -0.5) * fVar107 * fVar107) *
                               -2.0);
                    auVar84._8_4_ =
                         ~-(uint)(auVar110._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                                 fVar100 +
                                (((((((((fVar100 * 0.070376836 + -0.1151461) * fVar100 + 0.116769984
                                       ) * fVar100 + -0.12420141) * fVar100 + 0.14249323) * fVar100
                                    + -0.16668057) * fVar100 + 0.20000714) * fVar100 + -0.24999994)
                                  * fVar100 + 0.3333333) * fVar100 + -0.5) * fVar100 * fVar100) *
                               -2.0);
                    auVar84._12_4_ =
                         ~-(uint)(auVar110._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar76._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar108)) * 0.6931472
                                 + fVar103 +
                                (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984
                                       ) * fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103
                                    + -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994)
                                  * fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) *
                               -2.0);
                    auVar77._0_8_ =
                         CONCAT44(-(uint)(auVar110._4_4_ <= 0.0),-(uint)(auVar110._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar77._8_4_ = -(uint)(auVar110._8_4_ <= 0.0) & 0x7fffffff;
                    auVar77._12_4_ = -(uint)(auVar110._12_4_ <= 0.0) & 0x7fffffff;
                    auVar76 = minps(auVar77 | auVar84,auVar67);
                    auVar76 = maxps(auVar76,auVar68);
                    fVar104 = auVar76._0_4_ * 1.442695 + 0.5;
                    fVar105 = auVar76._4_4_ * 1.442695 + 0.5;
                    fVar106 = auVar76._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar76._12_4_ * 1.442695 + 0.5;
                    fVar93 = (float)(int)fVar104;
                    fVar100 = (float)(int)fVar105;
                    fVar102 = (float)(int)fVar106;
                    fVar103 = (float)(int)fVar107;
                    fVar93 = fVar93 - (float)(-(uint)(fVar104 < fVar93) & (uint)fVar66);
                    fVar100 = fVar100 - (float)(-(uint)(fVar105 < fVar100) & (uint)auVar95._0_4_);
                    fVar102 = fVar102 - (float)(-(uint)(fVar106 < fVar102) & (uint)fVar69);
                    fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar108);
                    fVar104 = auVar76._0_4_ - fVar93 * 0.6931472;
                    fVar105 = auVar76._4_4_ - fVar100 * 0.6931472;
                    fVar106 = auVar76._8_4_ - fVar102 * 0.6931472;
                    fVar107 = auVar76._12_4_ - fVar103 * 0.6931472;
                    auVar78._0_4_ =
                         fVar104 + fVar66 +
                         (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) *
                            fVar104 + 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) *
                         fVar104 * fVar104;
                    auVar78._4_4_ =
                         fVar105 + auVar95._0_4_ +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105;
                    auVar78._8_4_ =
                         fVar106 + fVar69 +
                         (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                            fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                         fVar106 * fVar106;
                    auVar78._12_4_ =
                         fVar107 + fVar108 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107;
                    fVar93 = (float)((int)fVar93 * 0x800000 + (int)fVar66) * auVar78._0_4_ + fVar66;
                    fVar100 = (float)((int)fVar100 * 0x800000 + (int)auVar95._0_4_) * auVar78._4_4_
                              + auVar95._0_4_;
                    fVar102 = (float)((int)fVar102 * 0x800000 + (int)fVar69) * auVar78._8_4_ +
                              fVar69;
                    fVar108 = (float)((int)fVar103 * 0x800000 + (int)fVar108) * auVar78._12_4_ +
                              fVar108;
                    auVar20._4_4_ = fVar100;
                    auVar20._0_4_ = fVar93;
                    auVar20._8_4_ = fVar102;
                    auVar20._12_4_ = fVar108;
                    auVar76 = rcpps(auVar78,auVar20);
                    fVar104 = auVar76._0_4_;
                    fVar105 = auVar76._4_4_;
                    fVar106 = auVar76._8_4_;
                    fVar107 = auVar76._12_4_;
                    auVar91._0_4_ =
                         fVar70 * (fVar104 + fVar104 + -1.0 +
                                  (2.0 - fVar93 * (fVar104 + fVar104)) * fVar104);
                    auVar91._4_4_ =
                         fVar94 * (fVar105 + fVar105 + -1.0 +
                                  (2.0 - fVar100 * (fVar105 + fVar105)) * fVar105);
                    auVar91._8_4_ =
                         fVar82 * (fVar106 + fVar106 + -1.0 +
                                  (2.0 - fVar102 * (fVar106 + fVar106)) * fVar106);
                    auVar91._12_4_ =
                         fVar101 * (fVar107 + fVar107 + -1.0 +
                                   (2.0 - fVar108 * (fVar107 + fVar107)) * fVar107);
                    break;
                  case 6:
                    fVar108 = **(float **)(&this->field_0x118 + (long)p_Var11);
                    fVar104 = (*(float **)(&this->field_0x118 + (long)p_Var11))[1];
                    auVar81._0_4_ = fVar108 * fVar70 + fVar104;
                    auVar81._4_4_ = fVar108 * fVar94 + fVar104;
                    auVar81._8_4_ = fVar108 * fVar82 + fVar104;
                    auVar81._12_4_ = fVar108 * fVar101 + fVar104;
                    auVar76 = maxps(auVar81,auVar76);
                    auVar76 = minps(auVar76,auVar21);
                    auVar91._0_4_ = fVar70 * auVar76._0_4_;
                    auVar91._4_4_ = fVar94 * auVar76._4_4_;
                    auVar91._8_4_ = fVar82 * auVar76._8_4_;
                    auVar91._12_4_ = fVar101 * auVar76._12_4_;
                  }
                  *pauVar57 = auVar91;
                  pauVar57 = pauVar57 + 1;
                  uVar45 = uVar45 + 1;
                  iVar33 = iVar33 + 1;
                } while (uVar45 != local_1b8.w);
              }
              local_278._0_4_ = (int)local_278 + 1;
            } while ((int)local_278 != local_1b8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_170);
      }
      local_140 = pp_Var12;
      if ((((int)local_138 == 4) && (uVar58 == 1)) && (local_80 = (long)local_1b8.c, 0 < local_80))
      {
        local_168 = (_func_int **)pp_Var12[-3];
        iVar6 = *(int *)(&this->field_0xdc + (long)local_168);
        iVar7 = *(int *)(&this->field_0xe0 + (long)local_168);
        iVar48 = *(int *)(&this->field_0xe4 + (long)local_168);
        iVar56 = *(int *)(&this->field_0xe8 + (long)local_168);
        uVar87 = *(undefined4 *)(&this->field_0x114 + (long)local_168);
        lVar41 = *(long *)(&this->field_0x1a8 + (long)local_168);
        uVar8 = *(uint *)(&this->field_0xd4 + (long)local_168);
        uVar9 = *(uint *)(&this->field_0xd8 + (long)local_168);
        local_140 = (_func_int **)local_1b8.data;
        local_88 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) *
                   local_1b8.cstep;
        iVar35 = bottom_blob->w;
        iVar38 = bottom_blob->h;
        local_160 = (long)(int)(uVar8 * uVar9 * 4);
        local_170 = CONCAT44(local_170._4_4_,(1 - uVar8) * iVar6);
        uVar10 = bottom_blob->c;
        lVar60 = (ulong)uVar8 * 4;
        local_1f8._0_8_ = lVar60;
        local_270 = 0;
        do {
          if (0 < iVar44) {
            sVar16 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            local_208 = (_func_int **)(local_88 * local_270 + (long)local_140);
            pvVar63 = (this->weight_data_tm).data;
            iVar59 = 0;
            do {
              if (0 < iVar61) {
                iVar33 = bottom_blob->w;
                pvVar15 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                sVar19 = bottom_blob->cstep;
                pfVar62 = *(float **)(&this->field_0x118 + (long)local_168);
                uVar45 = 0;
                local_220 = local_170 & 0xffffffff;
                do {
                  if (lVar41 == 0) {
                    fVar66 = 0.0;
                  }
                  else {
                    fVar66 = *(float *)(lVar41 + local_270 * 4);
                  }
                  if ((int)uVar10 < 1) {
                    auVar67 = ZEXT816(0);
                  }
                  else {
                    auVar67 = ZEXT816(0);
                    uVar46 = 0;
                    pvVar55 = (void *)(sVar16 * local_270 * sVar17 + (long)pvVar63);
                    do {
                      local_158._0_8_ = uVar46;
                      if (0 < (int)uVar9) {
                        uVar53 = 0;
                        uVar54 = 0;
                        do {
                          iVar34 = (((int)uVar54 - uVar9) + 1) * iVar7 + iVar59;
                          if (((-1 < iVar34) && (iVar36 = iVar34 / iVar56, iVar34 % iVar56 == 0)) &&
                             ((0 < (int)uVar8 && (iVar36 < iVar38)))) {
                            uVar50 = (ulong)uVar8;
                            uVar51 = uVar53;
                            auVar68 = auVar67;
                            iVar34 = (int)local_220;
                            do {
                              auVar67 = auVar68;
                              if (((-1 < iVar34) && (iVar37 = iVar34 / iVar48, iVar34 % iVar48 == 0)
                                  ) && (iVar37 < iVar35)) {
                                pfVar52 = (float *)((long)pvVar55 + (uVar51 & 0xffffffff) * 4);
                                pfVar2 = (float *)((long)pvVar15 +
                                                  (long)(iVar37 << 2) * 4 +
                                                  (long)iVar36 * (long)iVar33 * sVar18 +
                                                  sVar19 * sVar18 * uVar46);
                                auVar67._0_4_ = auVar68._0_4_ + *pfVar52 * *pfVar2;
                                auVar67._4_4_ = auVar68._4_4_ + pfVar52[1] * pfVar2[1];
                                auVar67._8_4_ = auVar68._8_4_ + pfVar52[2] * pfVar2[2];
                                auVar67._12_4_ = auVar68._12_4_ + pfVar52[3] * pfVar2[3];
                              }
                              uVar51 = uVar51 + 4;
                              iVar34 = iVar34 + iVar6;
                              uVar50 = uVar50 - 1;
                              auVar68 = auVar67;
                            } while (uVar50 != 0);
                          }
                          uVar54 = uVar54 + 1;
                          uVar53 = uVar53 + lVar60;
                        } while (uVar54 != uVar9);
                      }
                      pvVar55 = (void *)((long)pvVar55 + local_160 * 4);
                      uVar46 = uVar46 + 1;
                    } while (uVar46 != uVar10);
                  }
                  auVar68._4_4_ = auVar67._12_4_ + auVar67._4_4_;
                  auVar68._0_4_ = auVar68._4_4_;
                  auVar68._8_4_ = auVar68._4_4_;
                  auVar68._12_4_ = auVar68._4_4_;
                  auVar95._4_12_ = auVar68._4_12_;
                  auVar95._0_4_ = auVar68._4_4_ + fVar66 + auVar67._8_4_ + auVar67._0_4_;
                  fVar66 = auVar95._0_4_;
                  switch(uVar87) {
                  case 1:
                    if (auVar95._0_4_ <= 0.0) {
                      auVar21._12_4_ = 0;
                      auVar21._0_12_ = auVar95._4_12_;
                      auVar95 = auVar21 << 0x20;
                    }
LAB_0028757c:
                    fVar66 = auVar95._0_4_;
                    break;
                  case 2:
                    fVar66 = (float)(~-(uint)(0.0 < auVar95._0_4_) & (uint)*pfVar62 |
                                    -(uint)(0.0 < auVar95._0_4_) & 0x3f800000) * auVar95._0_4_;
                    break;
                  case 3:
                    if (auVar95._0_4_ <= *pfVar62) {
                      auVar95._0_4_ = *pfVar62;
                    }
                    fVar66 = auVar95._0_4_;
                    if (pfVar62[1] < auVar95._0_4_) {
                      fVar66 = pfVar62[1];
                    }
                    break;
                  case 4:
                    if (88.37626 <= auVar95._0_4_) {
                      auVar95._0_4_ = 88.37626;
                    }
                    fVar66 = expf((float)(-(uint)(auVar95._0_4_ < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(auVar95._0_4_ < -88.37626) & (uint)-auVar95._0_4_)
                                 );
                    fVar66 = 1.0 / (fVar66 + 1.0);
                    break;
                  case 5:
                    local_158 = auVar95;
                    fVar66 = expf(auVar95._0_4_);
                    fVar66 = logf(fVar66 + 1.0);
                    fVar66 = tanhf(fVar66);
                    fVar66 = fVar66 * (float)local_158._0_4_;
                    break;
                  case 6:
                    fVar69 = *pfVar62;
                    fVar108 = -pfVar62[1] / fVar69;
                    fVar66 = 0.0;
                    if (fVar108 <= auVar95._0_4_) {
                      if (fVar108 + 1.0 / fVar69 < auVar95._0_4_) goto LAB_0028757c;
                      fVar66 = (fVar69 * auVar95._0_4_ + pfVar62[1]) * auVar95._0_4_;
                    }
                  }
                  *(float *)local_208 = fVar66;
                  local_208 = (_func_int **)((long)local_208 + 4);
                  uVar45 = uVar45 + 1;
                  local_220 = (ulong)((int)local_220 + 1);
                } while (uVar45 != iVar61);
              }
              iVar59 = iVar59 + 1;
            } while (iVar59 != iVar44);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_80);
      }
      iVar7 = local_1b8.h;
      iVar6 = local_1b8.w;
      if ((((int)local_138 == 1) && (uVar58 == 1)) &&
         (pp_Var12 = this->_vptr_Deconvolution_x86,
         0 < *(int *)(&this->field_0xd0 + (long)pp_Var12[-3]))) {
        local_168 = (_func_int **)local_1b8.data;
        local_170 = local_1b8.cstep *
                    CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
        iVar61 = bottom_blob->w;
        iVar44 = bottom_blob->h;
        uVar58 = bottom_blob->c;
        uVar46 = (ulong)(uint)local_1b8.w;
        lVar60 = (long)local_1b8.w;
        local_158._0_8_ = (long)iVar49 << 2;
        local_218 = 0;
        do {
          if (0 < iVar7) {
            local_1e0 = (_func_int **)(local_170 * local_218 + (long)local_168);
            pp_Var39 = this->_vptr_Deconvolution_x86;
            sVar16 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            pvVar63 = (this->weight_data_tm).data;
            iVar49 = 0;
            do {
              if (0 < iVar6) {
                iVar56 = bottom_blob->w;
                pvVar15 = bottom_blob->data;
                sVar18 = bottom_blob->elemsize;
                local_160 = bottom_blob->cstep * sVar18;
                pp_Var40 = this->_vptr_Deconvolution_x86;
                uVar54 = 0;
                iVar48 = -iVar32;
                do {
                  p_Var11 = pp_Var39[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var11) == 0) {
                    auVar85 = ZEXT812(0);
                  }
                  else {
                    auVar85._4_8_ = 0;
                    auVar85._0_4_ =
                         *(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var11) + local_218 * 4);
                  }
                  auVar86._12_4_ = 0;
                  auVar86._0_12_ = auVar85;
                  if (0 < (int)uVar58) {
                    p_Var11 = pp_Var40[-3];
                    local_1f8._0_8_ = (void *)(sVar16 * sVar17 * local_218 + (long)pvVar63);
                    uVar53 = 0;
                    do {
                      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var11)) {
                        iVar35 = 0;
                        do {
                          iVar38 = *(int *)(&this->field_0xe0 + (long)p_Var11) * iVar35 +
                                   (iVar49 - iVar43);
                          if (((-1 < iVar38) &&
                              (iVar59 = iVar38 / *(int *)(&this->field_0xe8 + (long)p_Var11),
                              iVar38 % *(int *)(&this->field_0xe8 + (long)p_Var11) == 0)) &&
                             (iVar59 < iVar44)) {
                            iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var11);
                            if (0 < (long)iVar38) {
                              lVar41 = 0;
                              iVar33 = iVar48;
                              do {
                                if (((-1 < iVar33) &&
                                    (iVar34 = iVar33 / *(int *)(&this->field_0xe4 + (long)p_Var11),
                                    iVar33 % *(int *)(&this->field_0xe4 + (long)p_Var11) == 0)) &&
                                   (iVar34 < iVar61)) {
                                  auVar86._0_4_ =
                                       auVar86._0_4_ +
                                       *(float *)(local_1f8._0_8_ +
                                                  (ulong)(uint)(iVar38 * iVar35) * 4 + lVar41 * 4) *
                                       *(float *)((long)pvVar15 +
                                                 (long)iVar34 * 4 +
                                                 (long)iVar59 * (long)iVar56 * sVar18 +
                                                 local_160 * uVar53);
                                }
                                lVar41 = lVar41 + 1;
                                iVar33 = iVar33 + *(int *)(&this->field_0xdc + (long)p_Var11);
                              } while (iVar38 != lVar41);
                            }
                          }
                          iVar35 = iVar35 + 1;
                        } while (iVar35 != *(int *)(&this->field_0xd8 + (long)p_Var11));
                      }
                      uVar53 = uVar53 + 1;
                      local_1f8._0_8_ = local_1f8._0_8_ + local_158._0_8_;
                    } while (uVar53 != uVar58);
                  }
                  fVar66 = auVar86._0_4_;
                  p_Var11 = pp_Var39[-3];
                  auVar65 = auVar86;
                  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var11)) {
                  case 1:
                    if (fVar66 <= 0.0) {
                      auVar22._12_4_ = 0;
                      auVar22._0_12_ = auVar86._4_12_;
                      auVar65 = auVar22 << 0x20;
                    }
                    break;
                  case 2:
                    auVar65 = ZEXT416((uint)((float)(-(uint)(0.0 < fVar66) & 0x3f800000 |
                                                    ~-(uint)(0.0 < fVar66) &
                                                    **(uint **)(&this->field_0x118 + (long)p_Var11))
                                            * fVar66));
                    break;
                  case 3:
                    auVar95._0_4_ = **(float **)(&this->field_0x118 + (long)p_Var11);
                    if (fVar66 <= auVar95._0_4_) {
                      auVar86._0_4_ = auVar95._0_4_;
                    }
                    fVar66 = (*(float **)(&this->field_0x118 + (long)p_Var11))[1];
                    auVar65 = auVar86;
                    if (fVar66 < auVar86._0_4_) {
LAB_00287b76:
                      auVar65 = ZEXT416((uint)fVar66);
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar66) {
                      fVar66 = 88.37626;
                    }
                    fVar66 = expf((float)(-(uint)(fVar66 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar66 < -88.37626) & (uint)-fVar66));
                    auVar65 = ZEXT416((uint)(1.0 / (fVar66 + 1.0)));
                    break;
                  case 5:
                    auVar95._0_4_ = expf(fVar66);
                    auVar95._0_4_ = logf(auVar95._0_4_ + 1.0);
                    auVar95._0_4_ = tanhf(auVar95._0_4_);
                    auVar65._0_4_ = auVar95._0_4_ * fVar66;
                    auVar65._4_12_ = extraout_var;
                    local_1f8 = auVar86;
                    break;
                  case 6:
                    auVar95._0_4_ = **(float **)(&this->field_0x118 + (long)p_Var11);
                    fVar69 = (*(float **)(&this->field_0x118 + (long)p_Var11))[1];
                    fVar108 = -fVar69 / auVar95._0_4_;
                    auVar65 = ZEXT816(0);
                    if ((fVar108 <= fVar66) &&
                       (auVar65 = auVar86, fVar66 <= fVar108 + 1.0 / auVar95._0_4_)) {
                      fVar66 = (auVar95._0_4_ * fVar66 + fVar69) * fVar66;
                      goto LAB_00287b76;
                    }
                  }
                  *(int *)((long)local_1e0 + uVar54 * 4) = auVar65._0_4_;
                  uVar54 = uVar54 + 1;
                  iVar48 = iVar48 + 1;
                } while (uVar54 != uVar46);
              }
              local_1e0 = (_func_int **)((long)local_1e0 + lVar60 * 4);
              iVar49 = iVar49 + 1;
            } while (iVar49 != iVar7);
          }
          local_218 = local_218 + 1;
        } while (local_218 < *(int *)(&this->field_0xd0 + (long)pp_Var12[-3]));
      }
    }
    pMVar31 = local_130;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86 + (long)this->_vptr_Deconvolution_x86[-3]),
               &local_1b8,local_130,local_148);
    iVar49 = -100;
    if ((pMVar31->data != (void *)0x0) && (iVar49 = -100, (long)pMVar31->c * pMVar31->cstep != 0)) {
      iVar49 = 0;
    }
  }
  piVar13 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if ((_func_int **)local_1b8.data != (_func_int **)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar49;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}